

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool Line_To(black_PWorker worker,Long x,Long y)

{
  TStates TVar1;
  Bool BVar2;
  Long y_local;
  Long x_local;
  black_PWorker worker_local;
  
  TVar1 = worker->state;
  if (TVar1 == Unknown_State) {
    if (worker->lastY < y) {
      BVar2 = New_Profile(worker,Ascending_State,
                          (long)worker->precision_half <=
                          (long)(((worker->lastY + (long)worker->precision) - 1U &
                                 (long)-worker->precision) - worker->lastY));
      if (BVar2 != '\0') {
        return '\x01';
      }
    }
    else if ((y < worker->lastY) &&
            (BVar2 = New_Profile(worker,Descending_State,
                                 (long)worker->precision_half <=
                                 worker->lastY - (worker->lastY & (long)-worker->precision)),
            BVar2 != '\0')) {
      return '\x01';
    }
  }
  else if (TVar1 == Ascending_State) {
    if ((y < worker->lastY) &&
       ((BVar2 = End_Profile(worker,(long)worker->precision_half <=
                                    worker->lastY - (worker->lastY & (long)-worker->precision)),
        BVar2 != '\0' ||
        (BVar2 = New_Profile(worker,Descending_State,
                             (long)worker->precision_half <=
                             worker->lastY - (worker->lastY & (long)-worker->precision)),
        BVar2 != '\0')))) {
      return '\x01';
    }
  }
  else if (((TVar1 == Descending_State) && (worker->lastY < y)) &&
          ((BVar2 = End_Profile(worker,(long)worker->precision_half <=
                                       (long)(((worker->lastY + (long)worker->precision) - 1U &
                                              (long)-worker->precision) - worker->lastY)),
           BVar2 != '\0' ||
           (BVar2 = New_Profile(worker,Ascending_State,
                                (long)worker->precision_half <=
                                (long)(((worker->lastY + (long)worker->precision) - 1U &
                                       (long)-worker->precision) - worker->lastY)), BVar2 != '\0')))
          ) {
    return '\x01';
  }
  if (worker->state == Ascending_State) {
    BVar2 = Line_Up(worker,worker->lastX,worker->lastY,x,y,worker->minY,worker->maxY);
    if (BVar2 != '\0') {
      return '\x01';
    }
  }
  else if ((worker->state == Descending_State) &&
          (BVar2 = Line_Down(worker,worker->lastX,worker->lastY,x,y,worker->minY,worker->maxY),
          BVar2 != '\0')) {
    return '\x01';
  }
  worker->lastX = x;
  worker->lastY = y;
  return '\0';
}

Assistant:

static Bool
  Line_To( RAS_ARGS Long  x,
                    Long  y )
  {
    /* First, detect a change of direction */

    switch ( ras.state )
    {
    case Unknown_State:
      if ( y > ras.lastY )
      {
        if ( New_Profile( RAS_VARS Ascending_State,
                                   IS_BOTTOM_OVERSHOOT( ras.lastY ) ) )
          return FAILURE;
      }
      else
      {
        if ( y < ras.lastY )
          if ( New_Profile( RAS_VARS Descending_State,
                                     IS_TOP_OVERSHOOT( ras.lastY ) ) )
            return FAILURE;
      }
      break;

    case Ascending_State:
      if ( y < ras.lastY )
      {
        if ( End_Profile( RAS_VARS IS_TOP_OVERSHOOT( ras.lastY ) ) ||
             New_Profile( RAS_VARS Descending_State,
                                   IS_TOP_OVERSHOOT( ras.lastY ) ) )
          return FAILURE;
      }
      break;

    case Descending_State:
      if ( y > ras.lastY )
      {
        if ( End_Profile( RAS_VARS IS_BOTTOM_OVERSHOOT( ras.lastY ) ) ||
             New_Profile( RAS_VARS Ascending_State,
                                   IS_BOTTOM_OVERSHOOT( ras.lastY ) ) )
          return FAILURE;
      }
      break;

    default:
      ;
    }

    /* Then compute the lines */

    switch ( ras.state )
    {
    case Ascending_State:
      if ( Line_Up( RAS_VARS ras.lastX, ras.lastY,
                             x, y, ras.minY, ras.maxY ) )
        return FAILURE;
      break;

    case Descending_State:
      if ( Line_Down( RAS_VARS ras.lastX, ras.lastY,
                               x, y, ras.minY, ras.maxY ) )
        return FAILURE;
      break;

    default:
      ;
    }

    ras.lastX = x;
    ras.lastY = y;

    return SUCCESS;
  }